

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

ChGenotype * __thiscall
chrono::ChOptimizerGenetic::Select_roulette(ChOptimizerGenetic *this,ChGenotype **my_population)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ChGenotype *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ChGenotype *pCVar8;
  ChGenotype *pCVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pCVar4 = *my_population;
  iVar3 = *(int *)&(this->super_ChOptimizer).field_0x144;
  lVar7 = (long)iVar3;
  pCVar8 = pCVar4;
  if (0 < lVar7) {
    auVar15 = ZEXT864((ulong)pCVar4->fitness);
    lVar10 = 0;
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    do {
      dVar12 = my_population[lVar10]->fitness;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar12;
      auVar14 = vandpd_avx(auVar20,auVar16);
      uVar5 = vcmppd_avx512vl(auVar14,ZEXT816(0x412e847e00000000),4);
      uVar6 = vcmppd_avx512vl(auVar20,auVar15._0_16_,1);
      bVar11 = (bool)((byte)uVar5 & 3 & (byte)uVar6 & 1);
      if (bVar11 != false) {
        pCVar8 = my_population[lVar10];
      }
      auVar15 = ZEXT1664(CONCAT88(auVar15._8_8_,
                                  (ulong)bVar11 * (long)dVar12 + (ulong)!bVar11 * auVar15._0_8_));
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = pCVar8->fitness;
  pCVar9 = pCVar4;
  if (0 < iVar3) {
    auVar15 = ZEXT864((ulong)pCVar4->fitness);
    lVar10 = 0;
    auVar18._8_8_ = 0x7fffffffffffffff;
    auVar18._0_8_ = 0x7fffffffffffffff;
    do {
      dVar12 = my_population[lVar10]->fitness;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar12;
      auVar16 = vandpd_avx(auVar24,auVar18);
      uVar5 = vcmppd_avx512vl(auVar16,ZEXT816(0x412e847e00000000),4);
      uVar6 = vcmppd_avx512vl(auVar15._0_16_,auVar24,1);
      bVar11 = (bool)((byte)uVar5 & 3 & (byte)uVar6 & 1);
      if (bVar11 != false) {
        pCVar9 = my_population[lVar10];
      }
      auVar15 = ZEXT1664(CONCAT88(auVar15._8_8_,
                                  (ulong)bVar11 * (long)dVar12 + (ulong)!bVar11 * auVar15._0_8_));
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->eugenetics;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = pCVar9->fitness - pCVar8->fitness;
  auVar16 = vfmadd132sd_fma(auVar25,auVar14,auVar2);
  if (iVar3 < 1) {
    dVar12 = 0.0;
  }
  else {
    lVar10 = 0;
    auVar17._8_8_ = 0x7fffffffffffffff;
    auVar17._0_8_ = 0x7fffffffffffffff;
    dVar12 = 0.0;
    do {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = my_population[lVar10]->fitness;
      auVar14 = vandpd_avx(auVar21,auVar17);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = my_population[lVar10]->fitness - auVar16._0_8_;
      auVar20 = vmaxsd_avx(ZEXT816(0),auVar22);
      uVar5 = vcmpsd_avx512f(auVar14,ZEXT816(0x412e847e00000000),4);
      bVar11 = (bool)((byte)uVar5 & 1);
      dVar12 = (double)((ulong)bVar11 * (long)(dVar12 + auVar20._0_8_) +
                       (ulong)!bVar11 * (long)dVar12);
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  dVar13 = ChRandom();
  lVar7 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
  if (0 < lVar7) {
    lVar10 = 0;
    auVar19._8_8_ = 0x7fffffffffffffff;
    auVar19._0_8_ = 0x7fffffffffffffff;
    dVar23 = 0.0;
    do {
      dVar1 = my_population[lVar10]->fitness;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar1;
      auVar14 = vandpd_avx(auVar26,auVar19);
      if ((auVar14._0_8_ != 999999.0) || (NAN(auVar14._0_8_))) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar1 - auVar16._0_8_;
        auVar14 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar27);
        dVar23 = dVar23 + auVar14._0_8_;
        if (dVar13 * dVar12 <= dVar23) {
          return my_population[lVar10];
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  return pCVar4;
}

Assistant:

ChGenotype* ChOptimizerGenetic::Select_roulette(ChGenotype** my_population) {
    ChGenotype* mselected = my_population[0];

    // compute sum of all fitness, relative to worst.
    double msum = 0;
    double norm_fitness;
    double minf_fit = Select_worst(my_population)->fitness;
    double msup_fit = Select_best(my_population)->fitness;
    double clamp_fit = minf_fit + eugenetics * (msup_fit - minf_fit);

    int i;
    for (i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE) {
            norm_fitness = my_population[i]->fitness - clamp_fit;
            if (norm_fitness < 0)
                norm_fitness = 0;
            msum = msum + norm_fitness;
        }
    }

    double number = ChRandom() * msum;  // the sorted-out number!
    double partialsum = 0;
    for (i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE) {
            norm_fitness = my_population[i]->fitness - clamp_fit;
            if (norm_fitness < 0)
                norm_fitness = 0;
            partialsum = partialsum + norm_fitness;
            if (partialsum >= number)
                return my_population[i];  // the number was ok.
        }
    }
    // default .
    return mselected;
}